

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O2

monst * clone_mon(monst *mon,xchar x,xchar y)

{
  xchar x_00;
  xchar y_00;
  uint uVar1;
  level *plVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  boolean bVar6;
  schar sVar7;
  int iVar8;
  int iVar9;
  undefined8 in_RAX;
  monst *mon_00;
  char *pcVar10;
  monst *pmVar11;
  monst *mtmp2;
  char cVar12;
  long lVar13;
  schar sVar14;
  uint uVar15;
  permonst *pm;
  monst *pmVar16;
  uint uVar17;
  byte bVar18;
  undefined6 uStack_38;
  coord mm;
  
  bVar18 = 0;
  if (mon->mhp < 2) {
    return (monst *)0x0;
  }
  _uStack_38 = in_RAX;
  iVar8 = monsndx(mon->data);
  if ((mvitals[iVar8].mvflags & 1) != 0) {
    return (monst *)0x0;
  }
  if (x == '\0') {
    _uStack_38 = CONCAT16(mon->mx,uStack_38);
    _uStack_38 = CONCAT17(mon->my,_uStack_38);
    bVar6 = enexto(&mm,level,mon->mx,mon->my,mon->data);
    if (bVar6 == '\0') {
      return (monst *)0x0;
    }
    pcVar10 = level->levname + (long)mm.x * 0xa8;
LAB_001b33cb:
    if ((*(long *)(pcVar10 + (long)mm.y * 8 + 0x8380) != 0) &&
       ((*(byte *)(*(long *)(pcVar10 + (long)mm.y * 8 + 0x8380) + 0x61) & 2) == 0)) {
      return (monst *)0x0;
    }
  }
  else {
    if (0x14 < (byte)y || 0x4f < (byte)x) {
      return (monst *)0x0;
    }
    _uStack_38 = CONCAT16(x,uStack_38);
    _uStack_38 = CONCAT17(y,_uStack_38);
    pmVar11 = level->monsters[(byte)x][(byte)y];
    if ((pmVar11 != (monst *)0x0) && ((pmVar11->field_0x61 & 2) == 0)) {
      bVar6 = enexto(&mm,level,x,y,mon->data);
      if (bVar6 == '\0') {
        return (monst *)0x0;
      }
      pcVar10 = level->levname + (long)mm.x * 0xa8;
      goto LAB_001b33cb;
    }
  }
  mon_00 = newmonst(0,0);
  pmVar11 = mon;
  pmVar16 = mon_00;
  for (lVar13 = 0xf; plVar2 = level, lVar13 != 0; lVar13 = lVar13 + -1) {
    pmVar16->nmon = pmVar11->nmon;
    pmVar11 = (monst *)((long)pmVar11 + (ulong)bVar18 * -0x10 + 8);
    pmVar16 = (monst *)((long)pmVar16 + (ulong)bVar18 * -0x10 + 8);
  }
  mon_00->nmon = level->monlist;
  plVar2->monlist = mon_00;
  uVar1 = flags.ident;
  uVar15 = flags.ident + 1;
  uVar17 = uVar15;
  mon_00->m_id = flags.ident;
  flags.ident = uVar17;
  if (uVar1 == 0) {
    flags.ident = 2;
    mon_00->m_id = uVar15;
  }
  mon_00->mx = mm.x;
  mon_00->my = mm.y;
  mon_00->minvent = (obj *)0x0;
  uVar15 = *(uint *)&mon_00->field_0x60;
  uVar17 = uVar15 & 0xfeffffff;
  *(uint *)&mon_00->field_0x60 = uVar17;
  mon_00->mhpmax = mon->mhpmax;
  iVar8 = mon->mhp;
  iVar9 = iVar8 / 2;
  mon_00->mhp = iVar9;
  mon->mhp = iVar8 - iVar9;
  uVar1 = *(uint *)&mon->field_0x60;
  if ((uVar1 & 0x1a000000) != 0) {
    uVar15 = uVar15 & 0xfcffffff;
    if ((uVar1 >> 0x19 & 1) == 0) {
      uVar15 = uVar17;
    }
    uVar17 = uVar15 & 0xf6ffffff;
    if ((uVar1 >> 0x1b & 1) == 0) {
      uVar17 = uVar15;
    }
    uVar15 = uVar17 & 0xeeffffff;
    if ((uVar1 >> 0x1c & 1) == 0) {
      uVar15 = uVar17;
    }
    *(uint *)&mon_00->field_0x60 = uVar15;
  }
  mon_00->mxlth = 0;
  place_monster(mon_00,(int)mm.x,(int)mm.y);
  pm = mon_00->data;
  if ((pm == mons + 0x101 || (pm == mons + 0x21 || pm == mons + 0x20)) || pm->mlet == '\x19') {
LAB_001b358b:
    uVar15 = 1;
    plVar2 = mon_00->dlevel;
    x_00 = mon_00->mx;
    y_00 = mon_00->my;
    if ((pm != mons + 0x101 && (pm != mons + 0x21 && pm != mons + 0x20)) && pm->mlet != '\x19') {
      pcVar10 = mons_mname(pm);
      iVar8 = strcmp(pcVar10,"gold dragon");
      if (iVar8 != 0) {
        pcVar10 = mons_mname(mon_00->data);
        iVar8 = strcmp(pcVar10,"baby gold dragon");
        if ((iVar8 != 0) && (mon_00->data != mons + 0x73)) {
          uVar15 = (uint)(mon_00->data == mons + 0xa0);
        }
      }
    }
    new_light_source(plVar2,x_00,y_00,uVar15,1,mon_00);
  }
  else {
    pcVar10 = mons_mname(pm);
    iVar8 = strcmp(pcVar10,"gold dragon");
    pm = mon_00->data;
    if (iVar8 == 0) goto LAB_001b358b;
    pcVar10 = mons_mname(pm);
    iVar8 = strcmp(pcVar10,"baby gold dragon");
    pm = mon_00->data;
    if ((iVar8 == 0) || (pm == mons + 0xa0 || pm == mons + 0x73)) goto LAB_001b358b;
  }
  if (mon_00->mnamelth == '\0') {
    if ((mon->field_0x63 & 2) == 0) goto LAB_001b3692;
    pcVar10 = shkname(mon);
  }
  else {
    mon_00->mnamelth = '\0';
    pcVar10 = (char *)((long)(mon->mtrack + 0x18) + (long)mon->mxlth);
  }
  mon_00 = christen_monst(mon_00,pcVar10);
LAB_001b3692:
  if (flags.mon_moving == '\0') {
    if (mon->mtame == '\0') {
      if ((mon->field_0x62 & 0x40) != 0) {
        cVar12 = '\0';
        if ('\0' < u.uluck) {
          cVar12 = u.uluck;
        }
        iVar8 = rn2((uint)(byte)(cVar12 + 2));
        *(uint *)&mon_00->field_0x60 =
             *(uint *)&mon_00->field_0x60 & 0xffbfffff | (uint)(iVar8 != 0) << 0x16;
      }
    }
    else {
      sVar14 = '\0';
      sVar7 = u.uluck;
      if (u.uluck < '\x01') {
        sVar7 = '\0';
      }
      iVar8 = rn2((uint)(byte)(sVar7 + 2));
      if (iVar8 != 0) {
        sVar14 = mon->mtame;
      }
      mon_00->mtame = sVar14;
    }
  }
  newsym((int)mon_00->mx,(int)mon_00->my);
  if (mon_00->mtame != '\0') {
    if ((mon->field_0x63 & 4) == 0) {
      mon_00->mtame = '\0';
      pmVar11 = tamedog(mon_00,(obj *)0x0);
      if (pmVar11 != (monst *)0x0) {
        *(undefined4 *)((long)&pmVar11[1].minvent + 4) = *(undefined4 *)((long)&mon[1].minvent + 4);
        uVar3 = *(undefined8 *)&mon->field_0x74;
        uVar4 = *(undefined8 *)((long)&mon[1].nmon + 4);
        uVar5 = *(undefined8 *)((long)&mon[1].dlevel + 4);
        *(undefined8 *)((long)&pmVar11[1].data + 4) = *(undefined8 *)((long)&mon[1].data + 4);
        *(undefined8 *)((long)&pmVar11[1].dlevel + 4) = uVar5;
        *(undefined8 *)&pmVar11->field_0x74 = uVar3;
        *(undefined8 *)((long)&pmVar11[1].nmon + 4) = uVar4;
        mon_00 = pmVar11;
      }
    }
    else {
      mtmp2 = newmonst(1,(uint)mon->mnamelth);
      pmVar11 = mon_00;
      pmVar16 = mtmp2;
      for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
        pmVar16->nmon = pmVar11->nmon;
        pmVar11 = (monst *)((long)pmVar11 + (ulong)bVar18 * -0x10 + 8);
        pmVar16 = (monst *)((long)pmVar16 + (ulong)bVar18 * -0x10 + 8);
      }
      mtmp2->mxtyp = '\x01';
      mtmp2->mxlth = 6;
      if (mon_00->mnamelth != '\0') {
        strcpy((char *)((long)&mtmp2[1].nmon + 2),
               (char *)((long)(mon_00->mtrack + 0x18) + (long)mon_00->mxlth));
      }
      *(undefined2 *)&mtmp2[1].nmon = *(undefined2 *)&mon[1].nmon;
      *(undefined4 *)&mtmp2->field_0x74 = *(undefined4 *)&mon->field_0x74;
      replmon(mon_00,mtmp2);
      mon_00 = mtmp2;
    }
  }
  set_malign(mon_00);
  return mon_00;
}

Assistant:

struct monst *clone_mon(struct monst *mon,
			xchar x, xchar y)/* clone's preferred location or 0 (near mon) */
{
	coord mm;
	struct monst *m2;

	/* may be too weak or have been extinguished for population control */
	if (mon->mhp <= 1 || (mvitals[monsndx(mon->data)].mvflags & G_EXTINCT))
	    return NULL;

	if (x == 0) {
	    mm.x = mon->mx;
	    mm.y = mon->my;
	    if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		return NULL;
	} else if (!isok(x, y)) {
	    return NULL;	/* paranoia */
	} else {
	    mm.x = x;
	    mm.y = y;
	    if (MON_AT(level, mm.x, mm.y)) {
		if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		    return NULL;
	    }
	}
	m2 = newmonst(MX_NONE, 0);
	*m2 = *mon;			/* copy condition of old monster */
	m2->nmon = level->monlist;
	level->monlist = m2;
	m2->m_id = flags.ident++;
	if (!m2->m_id) m2->m_id = flags.ident++;	/* ident overflowed */
	m2->mx = mm.x;
	m2->my = mm.y;

	m2->minvent = NULL; /* objects don't clone */
	m2->mleashed = FALSE;
	/* Max HP the same, but current HP halved for both.  The caller
	 * might want to override this by halving the max HP also.
	 * When current HP is odd, the original keeps the extra point.
	 */
	m2->mhpmax = mon->mhpmax;
	m2->mhp = mon->mhp / 2;
	mon->mhp -= m2->mhp;

	/* since shopkeepers and guards will only be cloned if they've been
	 * polymorphed away from their original forms, the clone doesn't have
	 * room for the extra information.  we also don't want two shopkeepers
	 * around for the same shop.
	 */
	if (mon->isshk) m2->isshk = FALSE;
	if (mon->isgd) m2->isgd = FALSE;
	if (mon->ispriest) m2->ispriest = FALSE;
	m2->mxlth = 0;
	place_monster(m2, m2->mx, m2->my);
	if (emits_light(m2->data))
	    new_light_source(m2->dlevel, m2->mx, m2->my, emits_light(m2->data),
			     LS_MONSTER, m2);
	if (m2->mnamelth) {
	    m2->mnamelth = 0; /* or it won't get allocated */
	    m2 = christen_monst(m2, NAME(mon));
	} else if (mon->isshk) {
	    m2 = christen_monst(m2, shkname(mon));
	}

	/* not all clones caused by player are tame or peaceful */
	if (!flags.mon_moving) {
	    if (mon->mtame)
		m2->mtame = rn2(max(2 + u.uluck, 2)) ? mon->mtame : 0;
	    else if (mon->mpeaceful)
		m2->mpeaceful = rn2(max(2 + u.uluck, 2)) ? 1 : 0;
	}

	newsym(m2->mx,m2->my);	/* display the new monster */
	if (m2->mtame) {
	    struct monst *m3;

	    if (mon->isminion) {
		m3 = newmonst(MX_EPRI, mon->mnamelth);
		*m3 = *m2;
		m3->mxtyp = MX_EPRI;
		m3->mxlth = sizeof(struct epri);
		if (m2->mnamelth) strcpy(NAME(m3), NAME(m2));
		*(EPRI(m3)) = *(EPRI(mon));
		replmon(m2, m3);
		m2 = m3;
	    } else {
		/* because m2 is a copy of mon it is tame but not init'ed.
		 * however, tamedog will not re-tame a tame dog, so m2
		 * must be made non-tame to get initialized properly.
		 */
		m2->mtame = 0;
		if ((m3 = tamedog(m2, NULL)) != 0) {
		    m2 = m3;
		    *(EDOG(m2)) = *(EDOG(mon));
		}
	    }
	}
	set_malign(m2);

	return m2;
}